

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O0

unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> __thiscall
duckdb::LocalFileSystem::OpenFile
          (LocalFileSystem *this,string *path_p,FileOpenFlags flags,
          optional_ptr<duckdb::FileOpener,_true> opener)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  optional_ptr<duckdb::FileOpener,_true> opener_00;
  FileCompressionType FVar1;
  bool bVar2;
  FileLockType FVar3;
  uint uVar4;
  int __val;
  undefined8 uVar5;
  int *piVar6;
  ulong uVar7;
  char *pcVar8;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_> in_RDI;
  string extended_error;
  bool has_error;
  int retained_errno;
  flock fl;
  FileType file_type;
  int fd;
  mode_t filesec;
  bool open_write;
  bool open_read;
  int rc;
  int open_flags;
  Logger *logger;
  char *normalized_path;
  string path;
  pid_t in_stack_00000ec4;
  FileSystem *in_stack_00000ec8;
  string *in_stack_fffffffffffffb38;
  string *in_stack_fffffffffffffb40;
  string *in_stack_fffffffffffffb48;
  undefined7 in_stack_fffffffffffffb50;
  LogLevel in_stack_fffffffffffffb57;
  char *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  iterator in_stack_fffffffffffffb68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffb70;
  undefined1 *puVar9;
  allocator_type *in_stack_fffffffffffffb80;
  allocator *__a;
  int in_stack_fffffffffffffb8c;
  int in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  FileType in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  undefined4 uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb0;
  string *in_stack_fffffffffffffbb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  string *in_stack_fffffffffffffbd8;
  IOException *in_stack_fffffffffffffbe0;
  string local_370 [32];
  string local_350 [36];
  undefined1 local_32c [3];
  undefined1 local_329;
  undefined1 *local_308;
  undefined1 local_300 [64];
  undefined1 *local_2c0;
  undefined8 local_2b8;
  allocator local_271;
  string local_270 [32];
  string local_250 [32];
  string local_230 [35];
  byte local_20d;
  int local_20c;
  ulong local_208 [4];
  FileType local_1e8;
  undefined1 local_1e1;
  string local_1e0 [39];
  undefined1 local_1b9;
  undefined1 *local_198;
  undefined1 local_190 [64];
  undefined1 *local_150;
  undefined8 local_148;
  allocator local_101;
  string local_100 [32];
  undefined4 local_e0;
  int local_dc;
  uint local_d8;
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [38];
  undefined1 local_aa;
  byte local_a9;
  int local_a8;
  undefined4 local_a4;
  Logger *local_a0;
  undefined1 local_92;
  allocator local_91;
  string local_90 [48];
  char *local_60;
  string local_50 [48];
  optional_ptr local_20 [8];
  FileOpenFlags local_18;
  
  opener_00.ptr._4_4_ = in_stack_fffffffffffffbac;
  opener_00.ptr._0_4_ = in_stack_fffffffffffffba8;
  FileSystem::ExpandPath
            ((string *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),opener_00);
  local_60 = NormalizeLocalPath(in_stack_fffffffffffffb40);
  FVar1 = FileOpenFlags::Compression(&local_18);
  if (FVar1 != UNCOMPRESSED) {
    local_92 = 1;
    uVar5 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_90,"Unsupported compression type for default file system",&local_91);
    NotImplementedException::NotImplementedException
              ((NotImplementedException *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    local_92 = 0;
    __cxa_throw(uVar5,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  }
  bVar2 = duckdb::optional_ptr::operator_cast_to_bool(local_20);
  if (bVar2) {
    optional_ptr<duckdb::FileOpener,_true>::operator*
              ((optional_ptr<duckdb::FileOpener,_true> *)in_stack_fffffffffffffb40);
    local_a0 = Logger::Get((FileOpener *)0x57392c);
    uVar4 = (*local_a0->_vptr_Logger[2])(local_a0,"duckdb.FileSystem.LocalFileSystem.OpenFile",0x1e)
    ;
    if ((uVar4 & 1) != 0) {
      Logger::WriteLog((Logger *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                       in_stack_fffffffffffffb57,in_stack_fffffffffffffb48);
    }
  }
  FileOpenFlags::Verify(&local_18);
  local_a4 = 0;
  local_a9 = FileOpenFlags::OpenForReading(&local_18);
  local_aa = FileOpenFlags::OpenForWriting(&local_18);
  if (((local_a9 & 1) == 0) || (!(bool)local_aa)) {
    if ((local_a9 & 1) == 0) {
      if (!(bool)local_aa) {
        local_d2 = 1;
        uVar5 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_d0,"READ, WRITE or both should be specified when opening a file",&local_d1)
        ;
        InternalException::InternalException
                  ((InternalException *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
        local_d2 = 0;
        __cxa_throw(uVar5,&InternalException::typeinfo,InternalException::~InternalException);
      }
      local_a4 = 1;
    }
    else {
      local_a4 = 0;
    }
  }
  else {
    local_a4 = 2;
  }
  if ((bool)local_aa) {
    local_a4 = (uint)CONCAT12(8,(undefined2)local_a4);
    bVar2 = FileOpenFlags::CreateFileIfNotExists(&local_18);
    if (bVar2) {
      local_a4 = local_a4 | 0x40;
    }
    else {
      bVar2 = FileOpenFlags::OverwriteExistingFile(&local_18);
      if (bVar2) {
        local_a4 = local_a4 | 0x240;
      }
    }
    bVar2 = FileOpenFlags::OpenForAppending(&local_18);
    if (bVar2) {
      local_a4 = local_a4 | 0x400;
    }
  }
  bVar2 = FileOpenFlags::DirectIO(&local_18);
  if (bVar2) {
    local_a4 = local_a4 | 0x4000;
  }
  bVar2 = FileOpenFlags::CreatePrivateFile(&local_18);
  if (bVar2) {
    local_a4 = local_a4 | 0x80;
    local_d8 = 0x180;
  }
  else {
    local_d8 = 0x1b6;
  }
  bVar2 = FileOpenFlags::ExclusiveCreate(&local_18);
  if (bVar2) {
    local_a4 = local_a4 | 0x80;
  }
  local_dc = open(local_60,local_a4,(ulong)local_d8);
  if (local_dc == -1) {
    bVar2 = FileOpenFlags::ReturnNullIfNotExists(&local_18);
    if ((bVar2) && (piVar6 = __errno_location(), *piVar6 == 2)) {
      unique_ptr<duckdb::FileHandle,std::default_delete<duckdb::FileHandle>,true>::
      unique_ptr<std::default_delete<duckdb::FileHandle>,void>
                ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
                 in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    }
    else {
      bVar2 = FileOpenFlags::ReturnNullIfExists(&local_18);
      if ((!bVar2) || (piVar6 = __errno_location(), *piVar6 != 0x11)) {
        local_1e1 = 1;
        uVar5 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_100,"Cannot open file \"%s\": %s",&local_101);
        local_1b9 = 1;
        local_198 = local_190;
        __errno_location();
        ::std::__cxx11::to_string(in_stack_fffffffffffffb8c);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (in_stack_fffffffffffffb70,(char (*) [6])in_stack_fffffffffffffb68,
                   in_stack_fffffffffffffb60);
        local_1b9 = 0;
        local_150 = local_190;
        local_148 = 1;
        std::
        allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x573e84);
        __l._M_len = (size_type)in_stack_fffffffffffffb70;
        __l._M_array = in_stack_fffffffffffffb68;
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffb60,__l,(size_type)in_stack_fffffffffffffb58,
                        (hasher *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                        (key_equal *)in_stack_fffffffffffffb48,in_stack_fffffffffffffb80);
        ::std::__cxx11::string::string(local_1e0,local_50);
        piVar6 = __errno_location();
        strerror(*piVar6);
        IOException::IOException<std::__cxx11::string,char*>
                  ((IOException *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                   (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffbb0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                   (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
        local_1e1 = 0;
        __cxa_throw(uVar5,&IOException::typeinfo,IOException::~IOException);
      }
      unique_ptr<duckdb::FileHandle,std::default_delete<duckdb::FileHandle>,true>::
      unique_ptr<std::default_delete<duckdb::FileHandle>,void>
                ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
                 in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    }
  }
  else {
    FVar3 = FileOpenFlags::Lock(&local_18);
    uVar10 = CONCAT13(FVar3,(int3)in_stack_fffffffffffffbac);
    if (((FVar3 != NO_LOCK) &&
        (in_stack_fffffffffffffba8 = GetFileTypeInternal(in_stack_fffffffffffffbd0),
        local_1e8 = in_stack_fffffffffffffba8, in_stack_fffffffffffffba8 != FILE_TYPE_FIFO)) &&
       (in_stack_fffffffffffffba8 != FILE_TYPE_SOCKET)) {
      local_208[2] = 0;
      local_208[3] = 0;
      local_208[0] = 0;
      local_208[1] = 0;
      FVar3 = FileOpenFlags::Lock(&local_18);
      in_stack_fffffffffffffba4 = CONCAT13(FVar3,(int3)in_stack_fffffffffffffba4);
      local_208[0]._0_4_ = (uint)(FVar3 != READ_LOCK);
      local_208[1] = 0;
      local_208[2] = 0;
      in_stack_fffffffffffffba0 = fcntl(local_dc,6,local_208);
      local_a8 = in_stack_fffffffffffffba0;
      piVar6 = __errno_location();
      local_20c = *piVar6;
      local_20d = local_a8 == -1;
      ::std::__cxx11::string::string(local_230);
      if (((local_20d & 1) != 0) && (local_20c == 0x5f)) {
        FVar3 = FileOpenFlags::Lock(&local_18);
        if (FVar3 == READ_LOCK) {
          local_20d = 0;
          piVar6 = __errno_location();
          *piVar6 = 0;
        }
        else {
          ::std::__cxx11::string::operator=
                    (local_230,
                     "File locks are not supported for this file system, cannot open the file in read-write mode. Try opening the file in read-only mode"
                    );
        }
      }
      if ((local_20d & 1) != 0) {
        uVar7 = ::std::__cxx11::string::empty();
        if ((uVar7 & 1) != 0) {
          local_a8 = fcntl(local_dc,5,local_208);
          if (local_a8 == -1) {
            piVar6 = __errno_location();
            pcVar8 = strerror(*piVar6);
            ::std::__cxx11::string::operator=(local_230,pcVar8);
          }
          else {
            AdditionalProcessInfo_abi_cxx11_(in_stack_00000ec8,in_stack_00000ec4);
            ::std::__cxx11::string::operator=(local_230,local_250);
            ::std::__cxx11::string::~string(local_250);
          }
          FVar3 = FileOpenFlags::Lock(&local_18);
          if (FVar3 == WRITE_LOCK) {
            local_208[0] = local_208[0] & 0xffffffffffff0000;
            local_a8 = fcntl(local_dc,6,local_208);
            if (local_a8 != -1) {
              ::std::__cxx11::string::operator+=
                        (local_230,
                         ". However, you would be able to open this database in read-only mode, e.g. by using the -readonly parameter in the CLI"
                        );
            }
          }
        }
        __val = close(local_dc);
        local_a8 = __val;
        if (__val == -1) {
          ::std::__cxx11::string::operator+=(local_230,". Also, failed closing file");
        }
        ::std::__cxx11::string::operator+=
                  (local_230,". See also https://duckdb.org/docs/stable/connect/concurrency");
        uVar5 = __cxa_allocate_exception(0x10);
        __a = &local_271;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_270,"Could not set lock on file \"%s\": %s",__a);
        local_329 = 1;
        local_308 = local_300;
        ::std::__cxx11::to_string(__val);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (in_stack_fffffffffffffb70,(char (*) [6])in_stack_fffffffffffffb68,
                   in_stack_fffffffffffffb60);
        local_329 = 0;
        local_2c0 = local_300;
        local_2b8 = 1;
        puVar9 = local_32c;
        std::
        allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x5744b4);
        __l_00._M_len = (size_type)puVar9;
        __l_00._M_array = in_stack_fffffffffffffb68;
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffb60,__l_00,(size_type)in_stack_fffffffffffffb58,
                        (hasher *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                        (key_equal *)in_stack_fffffffffffffb48,(allocator_type *)__a);
        ::std::__cxx11::string::string(local_350,local_50);
        ::std::__cxx11::string::string(local_370,local_230);
        IOException::IOException<std::__cxx11::string,std::__cxx11::string>
                  (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
                   (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
        __cxa_throw(uVar5,&IOException::typeinfo,IOException::~IOException);
      }
      ::std::__cxx11::string::~string(local_230);
    }
    make_uniq<duckdb::UnixFileHandle,duckdb::LocalFileSystem&,std::__cxx11::string&,int&,duckdb::FileOpenFlags&>
              ((LocalFileSystem *)in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
               (int *)CONCAT44(uVar10,in_stack_fffffffffffffba8),
               (FileOpenFlags *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
    unique_ptr<duckdb::FileHandle,std::default_delete<duckdb::FileHandle>,true>::
    unique_ptr<duckdb::UnixFileHandle,std::default_delete<std::unique_ptr<duckdb::FileHandle,std::default_delete<duckdb::FileHandle>>>,void>
              ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
               in_stack_fffffffffffffb40,
               (unique_ptr<duckdb::UnixFileHandle,_std::default_delete<duckdb::UnixFileHandle>_> *)
               in_stack_fffffffffffffb38);
    unique_ptr<duckdb::UnixFileHandle,_std::default_delete<duckdb::UnixFileHandle>,_true>::
    ~unique_ptr((unique_ptr<duckdb::UnixFileHandle,_std::default_delete<duckdb::UnixFileHandle>,_true>
                 *)0x574787);
  }
  local_e0 = 1;
  ::std::__cxx11::string::~string(local_50);
  return (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)
         (__uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
         super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<FileHandle> LocalFileSystem::OpenFile(const string &path_p, FileOpenFlags flags,
                                                 optional_ptr<FileOpener> opener) {
	auto path = FileSystem::ExpandPath(path_p, opener);
	auto normalized_path = NormalizeLocalPath(path);
	if (flags.Compression() != FileCompressionType::UNCOMPRESSED) {
		throw NotImplementedException("Unsupported compression type for default file system");
	}

	if (opener) {
		DUCKDB_LOG_INFO(*opener, "duckdb.FileSystem.LocalFileSystem.OpenFile", path_p);
	}

	flags.Verify();

	int open_flags = 0;
	int rc;
	bool open_read = flags.OpenForReading();
	bool open_write = flags.OpenForWriting();
	if (open_read && open_write) {
		open_flags = O_RDWR;
	} else if (open_read) {
		open_flags = O_RDONLY;
	} else if (open_write) {
		open_flags = O_WRONLY;
	} else {
		throw InternalException("READ, WRITE or both should be specified when opening a file");
	}
	if (open_write) {
		// need Read or Write
		D_ASSERT(flags.OpenForWriting());
		open_flags |= O_CLOEXEC;
		if (flags.CreateFileIfNotExists()) {
			open_flags |= O_CREAT;
		} else if (flags.OverwriteExistingFile()) {
			open_flags |= O_CREAT | O_TRUNC;
		}
		if (flags.OpenForAppending()) {
			open_flags |= O_APPEND;
		}
	}
	if (flags.DirectIO()) {
#if defined(__sun) && defined(__SVR4)
		throw InvalidInputException("DIRECT_IO not supported on Solaris");
#endif
#if defined(__DARWIN__) || defined(__APPLE__) || defined(__OpenBSD__)
		// OSX does not have O_DIRECT, instead we need to use fcntl afterwards to support direct IO
#else
		open_flags |= O_DIRECT;
#endif
	}

	// Determine permissions
	mode_t filesec;
	if (flags.CreatePrivateFile()) {
		open_flags |= O_EXCL; // Ensure we error on existing files or the permissions may not set
		filesec = 0600;
	} else {
		filesec = 0666;
	}

	if (flags.ExclusiveCreate()) {
		open_flags |= O_EXCL;
	}

	// Open the file
	int fd = open(normalized_path, open_flags, filesec);

	if (fd == -1) {
		if (flags.ReturnNullIfNotExists() && errno == ENOENT) {
			return nullptr;
		}
		if (flags.ReturnNullIfExists() && errno == EEXIST) {
			return nullptr;
		}
		throw IOException("Cannot open file \"%s\": %s", {{"errno", std::to_string(errno)}}, path, strerror(errno));
	}

#if defined(__DARWIN__) || defined(__APPLE__)
	if (flags.DirectIO()) {
		// OSX requires fcntl for Direct IO
		rc = fcntl(fd, F_NOCACHE, 1);
		if (rc == -1) {
			throw IOException("Could not enable direct IO for file \"%s\": %s", path, strerror(errno));
		}
	}
#endif

	if (flags.Lock() != FileLockType::NO_LOCK) {
		// set lock on file
		// but only if it is not an input/output stream
		auto file_type = GetFileTypeInternal(fd);
		if (file_type != FileType::FILE_TYPE_FIFO && file_type != FileType::FILE_TYPE_SOCKET) {
			struct flock fl;
			memset(&fl, 0, sizeof fl);
			fl.l_type = flags.Lock() == FileLockType::READ_LOCK ? F_RDLCK : F_WRLCK;
			fl.l_whence = SEEK_SET;
			fl.l_start = 0;
			fl.l_len = 0;
			rc = fcntl(fd, F_SETLK, &fl);
			// Retain the original error.
			int retained_errno = errno;
			bool has_error = rc == -1;
			string extended_error;
			if (has_error) {
				if (retained_errno == ENOTSUP) {
					// file lock not supported for this file system
					if (flags.Lock() == FileLockType::READ_LOCK) {
						// for read-only, we ignore not-supported errors
						has_error = false;
						errno = 0;
					} else {
						extended_error = "File locks are not supported for this file system, cannot open the file in "
						                 "read-write mode. Try opening the file in read-only mode";
					}
				}
			}
			if (has_error) {
				if (extended_error.empty()) {
					// try to find out who is holding the lock using F_GETLK
					rc = fcntl(fd, F_GETLK, &fl);
					if (rc == -1) { // fnctl does not want to help us
						extended_error = strerror(errno);
					} else {
						extended_error = AdditionalProcessInfo(*this, fl.l_pid);
					}
					if (flags.Lock() == FileLockType::WRITE_LOCK) {
						// maybe we can get a read lock instead and tell this to the user.
						fl.l_type = F_RDLCK;
						rc = fcntl(fd, F_SETLK, &fl);
						if (rc != -1) { // success!
							extended_error +=
							    ". However, you would be able to open this database in read-only mode, e.g. by "
							    "using the -readonly parameter in the CLI";
						}
					}
				}
				rc = close(fd);
				if (rc == -1) {
					extended_error += ". Also, failed closing file";
				}
				extended_error += ". See also https://duckdb.org/docs/stable/connect/concurrency";
				throw IOException("Could not set lock on file \"%s\": %s", {{"errno", std::to_string(retained_errno)}},
				                  path, extended_error);
			}
		}
	}
	return make_uniq<UnixFileHandle>(*this, path, fd, flags);
}